

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O0

char16_t * icu_63::UCharsTrie::jumpByDelta(char16_t *pos)

{
  char16_t *pcVar1;
  uint local_14;
  char16_t *pcStack_10;
  int32_t delta;
  char16_t *pos_local;
  
  pcVar1 = pos + 1;
  local_14 = (uint)(ushort)*pos;
  pcStack_10 = pcVar1;
  if (0xfbff < local_14) {
    if (local_14 == 0xffff) {
      local_14 = CONCAT22(*pcVar1,pos[2]);
      pcStack_10 = pos + 3;
    }
    else {
      pcStack_10 = pos + 2;
      local_14 = (local_14 - 0xfc00) * 0x10000 | (uint)(ushort)*pcVar1;
    }
  }
  return pcStack_10 + (int)local_14;
}

Assistant:

static inline const char16_t *jumpByDelta(const char16_t *pos) {
        int32_t delta=*pos++;
        if(delta>=kMinTwoUnitDeltaLead) {
            if(delta==kThreeUnitDeltaLead) {
                delta=(pos[0]<<16)|pos[1];
                pos+=2;
            } else {
                delta=((delta-kMinTwoUnitDeltaLead)<<16)|*pos++;
            }
        }
        return pos+delta;
    }